

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_packssdw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint32_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  
  uVar6 = d->_l_ZMMReg[0];
  if (0x7ffe < (int)d->_l_ZMMReg[0]) {
    uVar6 = 0x7fff;
  }
  uVar2 = (uint16_t)uVar6;
  if ((int)uVar6 < -0x7fff) {
    uVar2 = 0x8000;
  }
  uVar6 = d->_l_ZMMReg[1];
  if (0x7ffe < (int)uVar6) {
    uVar6 = 0x7fff;
  }
  if ((int)uVar6 < -0x7fff) {
    uVar6 = 0xffff8000;
  }
  uVar7 = d->_l_ZMMReg[2];
  if (0x7ffe < (int)uVar7) {
    uVar7 = 0x7fff;
  }
  uVar5 = 0xffff8000;
  if ((int)uVar7 < -0x7fff) {
    uVar7 = uVar5;
  }
  uVar8 = d->_l_ZMMReg[3];
  if (0x7ffe < (int)uVar8) {
    uVar8 = 0x7fff;
  }
  if ((int)uVar8 < -0x7fff) {
    uVar8 = uVar5;
  }
  uVar3 = s->_l_ZMMReg[0];
  if (0x7ffe < (int)uVar3) {
    uVar3 = 0x7fff;
  }
  if ((int)uVar3 < -0x7fff) {
    uVar3 = uVar5;
  }
  uVar4 = s->_l_ZMMReg[1];
  if (0x7ffe < (int)uVar4) {
    uVar4 = 0x7fff;
  }
  if ((int)uVar4 < -0x7fff) {
    uVar4 = uVar5;
  }
  uVar5 = s->_l_ZMMReg[2];
  if (0x7ffe < (int)uVar5) {
    uVar5 = 0x7fff;
  }
  if ((int)uVar5 < -0x7fff) {
    uVar5 = 0xffff8000;
  }
  uVar1 = 0x7fff;
  if ((int)s->_l_ZMMReg[3] < 0x7fff) {
    uVar1 = s->_l_ZMMReg[3];
  }
  if ((int)uVar1 < -0x7fff) {
    uVar1 = 0xffff8000;
  }
  d->_w_ZMMReg[0] = uVar2;
  d->_w_ZMMReg[1] = (uint16_t)uVar6;
  d->_w_ZMMReg[2] = (uint16_t)uVar7;
  d->_w_ZMMReg[3] = (uint16_t)uVar8;
  d->_w_ZMMReg[4] = (uint16_t)uVar3;
  d->_w_ZMMReg[5] = (uint16_t)uVar4;
  d->_w_ZMMReg[6] = (uint16_t)uVar5;
  d->_w_ZMMReg[7] = (uint16_t)uVar1;
  return;
}

Assistant:

void glue(helper_packssdw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    Reg r;

    r.W(0) = satsw(d->L(0));
    r.W(1) = satsw(d->L(1));
#if SHIFT == 1
    r.W(2) = satsw(d->L(2));
    r.W(3) = satsw(d->L(3));
#endif
    r.W((2 << SHIFT) + 0) = satsw(s->L(0));
    r.W((2 << SHIFT) + 1) = satsw(s->L(1));
#if SHIFT == 1
    r.W(6) = satsw(s->L(2));
    r.W(7) = satsw(s->L(3));
#endif
    *d = r;
}